

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemoryRegion_conflict * memory_region_get_flatview_root(MemoryRegion_conflict *mr)

{
  _Bool _Var1;
  MemoryRegion_conflict *local_30;
  MemoryRegion_conflict *next;
  MemoryRegion_conflict *child;
  MemoryRegion_conflict *pMStack_18;
  uint found;
  MemoryRegion_conflict *mr_local;
  
  pMStack_18 = mr;
  do {
    if ((pMStack_18->enabled & 1U) == 0) {
      return (MemoryRegion_conflict *)0x0;
    }
    if ((pMStack_18->terminates & 1U) != 0) {
      return pMStack_18;
    }
    child._4_4_ = 0;
    local_30 = (MemoryRegion_conflict *)0x0;
    for (next = (MemoryRegion_conflict *)(pMStack_18->subregions).tqh_first;
        next != (MemoryRegion_conflict *)0x0;
        next = (MemoryRegion_conflict *)(next->subregions_link).tqe_next) {
      if ((next->enabled & 1U) != 0) {
        child._4_4_ = child._4_4_ + 1;
        if (1 < child._4_4_) {
          local_30 = (MemoryRegion_conflict *)0x0;
          break;
        }
        if ((next->addr == 0) && (_Var1 = int128_ge(next->size,pMStack_18->size), _Var1)) {
          local_30 = next;
        }
      }
    }
    if (child._4_4_ == 0) {
      return (MemoryRegion_conflict *)0x0;
    }
    if (local_30 == (MemoryRegion_conflict *)0x0) {
      return pMStack_18;
    }
    pMStack_18 = local_30;
  } while( true );
}

Assistant:

static MemoryRegion *memory_region_get_flatview_root(MemoryRegion *mr)
{
    while (mr->enabled) {
        if (!mr->terminates) {
            unsigned int found = 0;
            MemoryRegion *child, *next = NULL;
            QTAILQ_FOREACH(child, &mr->subregions, subregions_link) {
                if (child->enabled) {
                    if (++found > 1) {
                        next = NULL;
                        break;
                    }
                    if (!child->addr && int128_ge(mr->size, child->size)) {
                        /* A child is included in its entirety.  If it's the only
                         * enabled one, use it in the hope of finding an alias down the
                         * way. This will also let us share FlatViews.
                         */
                        next = child;
                    }
                }
            }
            if (found == 0) {
                return NULL;
            }
            if (next) {
                mr = next;
                continue;
            }
        }

        return mr;
    }

    return NULL;
}